

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

ExprBase * AnalyzeFunctionCall(ExpressionContext *ctx,SynFunctionCall *syntax)

{
  Allocator *allocator;
  long lVar1;
  InplaceStr name;
  undefined1 auVar2 [16];
  IntrusiveList<TypeHandle> generics_00;
  IntrusiveList<TypeHandle> generics_01;
  IntrusiveList<TypeHandle> generics_02;
  ArrayView<ArgumentData> arguments_00;
  ArrayView<ArgumentData> arguments_01;
  ArrayView<ArgumentData> arguments_02;
  bool bVar3;
  int iVar4;
  uint uVar5;
  ExprBase *value;
  TypeBase *pTVar6;
  undefined4 extraout_var;
  ExprBase *pEVar7;
  undefined4 extraout_var_00;
  FunctionValue *pFVar8;
  ExprSequence *this;
  VariableData *variable;
  ExprBase *pEVar9;
  _func_int **pp_Var10;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  SynIdentifier *in_RCX;
  char *msg;
  SynCallArgument *pSVar11;
  code *pcVar12;
  uint i;
  IntrusiveList<SynBase> *pIVar13;
  SynBase *pSVar14;
  ArrayView<FunctionValue> functions_00;
  ArrayView<FunctionValue> functions_01;
  ArrayView<FunctionValue> functions_02;
  ArrayView<FunctionValue> functions_03;
  ArrayView<FunctionValue> functions_04;
  ArrayView<FunctionValue> functions_05;
  IntrusiveList<SynIdentifier> path;
  ArrayView<ExprBase_*> arr;
  ArrayView<ExprBase_*> arr_00;
  IntrusiveList<ExprBase> arguments_2;
  undefined1 local_6e8 [32];
  ExprBase *call;
  ExprBase *definition;
  IntrusiveList<TypeHandle> generics;
  undefined4 uStack_694;
  undefined4 uStack_684;
  undefined4 uStack_674;
  ExprBase *local_670;
  SmallArray<FunctionValue,_32U> functions;
  SmallArray<ArgumentData,_16U> arguments;
  TypeHandle *node;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  
  value = AnalyzeExpression(ctx,syntax->value);
  if ((value->type != (TypeBase *)0x0) && (value->type->typeID == 0)) {
    functions.data = (FunctionValue *)0x0;
    functions.count = 0;
    functions.max = 0;
    pSVar11 = (syntax->arguments).head;
    while (pSVar11 != (SynCallArgument *)0x0) {
      pEVar7 = AnalyzeExpression(ctx,pSVar11->value);
      IntrusiveList<ExprBase>::push_back((IntrusiveList<ExprBase> *)&functions,pEVar7);
      pSVar11 = (SynCallArgument *)(pSVar11->super_SynBase).next;
      if ((pSVar11 == (SynCallArgument *)0x0) || ((pSVar11->super_SynBase).typeID != 0x18)) {
        pSVar11 = (SynCallArgument *)0x0;
      }
    }
    iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
    pEVar7 = (ExprBase *)CONCAT44(extraout_var_00,iVar4);
    pTVar6 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
    pEVar7->typeID = 0x29;
    pEVar7->source = &syntax->super_SynBase;
    pEVar7->type = pTVar6;
    pEVar7->next = (ExprBase *)0x0;
    pEVar7->listed = false;
    pEVar7->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240f18;
    pEVar7[1]._vptr_ExprBase = (_func_int **)value;
    *(FunctionValue **)&pEVar7[1].typeID = functions.data;
    pEVar7[1].source = (SynBase *)CONCAT44(functions.max,functions.count);
    return pEVar7;
  }
  generics.head = (TypeHandle *)0x0;
  generics.tail = (TypeHandle *)0x0;
  pIVar13 = &syntax->aliases;
  while (pSVar14 = pIVar13->head, pSVar14 != (SynBase *)0x0) {
    in_RCX = (SynIdentifier *)0x0;
    pTVar6 = AnalyzeType(ctx,pSVar14,true,(bool *)0x0);
    if (pTVar6 == ctx->typeAuto) {
      msg = "ERROR: explicit generic argument type can\'t be auto";
LAB_0016a854:
      anon_unknown.dwarf_b837c::Stop(ctx,&syntax->super_SynBase,msg);
    }
    if (pTVar6 == ctx->typeVoid) {
      msg = "ERROR: explicit generic argument cannot be a void type";
      goto LAB_0016a854;
    }
    iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x18);
    node = (TypeHandle *)CONCAT44(extraout_var,iVar4);
    node->type = pTVar6;
    node->next = (TypeHandle *)0x0;
    node->listed = false;
    IntrusiveList<TypeHandle>::push_back(&generics,node);
    pIVar13 = (IntrusiveList<SynBase> *)&pSVar14->next;
  }
  allocator = ctx->allocator;
  memset(functions.little,0,0x300);
  functions.count = 0;
  functions.max = 0x20;
  functions.data = functions.little;
  functions.allocator = allocator;
  SmallArray<ArgumentData,_16U>::SmallArray(&arguments,allocator);
  if ((value != (ExprBase *)0x0) && (value->typeID == 8)) {
    pp_Var10 = value[1]._vptr_ExprBase;
    if (pp_Var10 != (_func_int **)0x0) {
      iVar4 = *(int *)(pp_Var10 + 1);
      if (iVar4 == 0) {
        arguments_2.head = (ExprBase *)0x0;
        arguments_2.tail._0_4_ = 0;
        arguments_2.tail._4_4_ = 0;
        pSVar11 = (syntax->arguments).head;
        while (pSVar11 != (SynCallArgument *)0x0) {
          pEVar7 = AnalyzeExpression(ctx,pSVar11->value);
          IntrusiveList<ExprBase>::push_back(&arguments_2,pEVar7);
          pSVar11 = (SynCallArgument *)(pSVar11->super_SynBase).next;
          if ((pSVar11 == (SynCallArgument *)0x0) || ((pSVar11->super_SynBase).typeID != 0x18)) {
            pSVar11 = (SynCallArgument *)0x0;
          }
        }
        iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
        this = (ExprSequence *)CONCAT44(extraout_var_04,iVar4);
        pTVar6 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
      }
      else {
        if ((iVar4 != 0x18) || (*(char *)(pp_Var10 + 0x24) != '\0')) {
          if ((iVar4 == 0x1c) && (generics.head == (TypeHandle *)0x0)) {
            uVar5 = IntrusiveList<SynCallArgument>::size(&syntax->arguments);
            if (((uVar5 == 1) &&
                (((pSVar11 = (syntax->arguments).head, pSVar11->name == (SynIdentifier *)0x0 &&
                  (pSVar14 = pSVar11->value, pSVar14 != (SynBase *)0x0)) && (pSVar14->typeID == 7)))
                ) && (pSVar14[1]._vptr_SynBase == (_func_int **)0x0)) {
              pcVar12 = pp_Var10[0xc] + 0x68;
              do {
                lVar1 = *(long *)pcVar12;
                if (lVar1 == 0) {
                  iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
                  this = (ExprSequence *)CONCAT44(extraout_var_08,iVar4);
                  pTVar6 = ctx->typeBool;
                  (this->super_ExprBase).typeID = 3;
                  (this->super_ExprBase).source = &syntax->super_SynBase;
                  (this->super_ExprBase).type = pTVar6;
                  (this->super_ExprBase).next = (ExprBase *)0x0;
                  *(undefined2 *)&(this->super_ExprBase).listed = 0;
                  goto LAB_0016a834;
                }
                bVar3 = InplaceStr::operator==
                                  ((InplaceStr *)(*(long *)(*(long *)(lVar1 + 8) + 0x28) + 0x40),
                                   (InplaceStr *)&pSVar14[1].begin);
                pcVar12 = (code *)(lVar1 + 0x18);
              } while (!bVar3);
              iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
              this = (ExprSequence *)CONCAT44(extraout_var_07,iVar4);
              pTVar6 = ctx->typeBool;
              (this->super_ExprBase).typeID = 3;
              (this->super_ExprBase).source = &syntax->super_SynBase;
              (this->super_ExprBase).type = pTVar6;
              (this->super_ExprBase).next = (ExprBase *)0x0;
              *(undefined2 *)&(this->super_ExprBase).listed = 0x100;
LAB_0016a834:
              (this->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240470;
              goto LAB_0016a369;
            }
          }
          goto LAB_0016a075;
        }
        anon_unknown.dwarf_b837c::Report
                  (ctx,&syntax->super_SynBase,"ERROR: type \'%.*s\' is not fully defined",
                   (ulong)(uint)(*(int *)(pp_Var10 + 3) - (int)pp_Var10[2]));
        arguments_2.head = (ExprBase *)0x0;
        arguments_2.tail._0_4_ = 0;
        arguments_2.tail._4_4_ = 0;
        pSVar11 = (syntax->arguments).head;
        while (pSVar11 != (SynCallArgument *)0x0) {
          pEVar7 = AnalyzeExpression(ctx,pSVar11->value);
          IntrusiveList<ExprBase>::push_back(&arguments_2,pEVar7);
          pSVar11 = (SynCallArgument *)(pSVar11->super_SynBase).next;
          if ((pSVar11 == (SynCallArgument *)0x0) || ((pSVar11->super_SynBase).typeID != 0x18)) {
            pSVar11 = (SynCallArgument *)0x0;
          }
        }
        iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
        this = (ExprSequence *)CONCAT44(extraout_var_05,iVar4);
        pTVar6 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
      }
      (this->super_ExprBase).typeID = 0x29;
      (this->super_ExprBase).source = &syntax->super_SynBase;
      (this->super_ExprBase).type = pTVar6;
      (this->super_ExprBase).next = (ExprBase *)0x0;
      (this->super_ExprBase).listed = false;
      (this->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240f18;
      (this->expressions).data = (ExprBase **)value;
      *(ExprBase **)&(this->expressions).count = arguments_2.head;
      (this->expressions).little[0] =
           (ExprBase *)CONCAT44(arguments_2.tail._4_4_,arguments_2.tail._0_4_);
      goto LAB_0016a369;
    }
LAB_0016a075:
    pSVar14 = syntax->value;
    if ((pSVar14 == (SynBase *)0x0) || (pSVar14->typeID != 7)) {
LAB_0016a171:
      auVar2._8_8_ = 0;
      auVar2._0_8_ = in_RCX;
      pEVar7 = CreateVariableAccess
                         (ctx,pSVar14,(IntrusiveList<SynIdentifier>)(auVar2 << 0x40),
                          *(InplaceStr *)(value[1]._vptr_ExprBase + 2),false);
      if (pEVar7 != (ExprBase *)0x0) {
LAB_0016a19c:
        functions.count = 0;
        GetNodeFunctions(ctx,&syntax->super_SynBase,pEVar7,&functions);
        uVar5 = 0;
        do {
          if (functions.count <= uVar5) goto LAB_0016a2a0;
          pFVar8 = SmallArray<FunctionValue,_32U>::operator[](&functions,uVar5);
          uVar5 = uVar5 + 1;
        } while (pFVar8->function->type->returnType == ctx->typeVoid);
        if (arguments.count == 0) {
          AnalyzeFunctionArgumentsEarly(ctx,(syntax->arguments).head,&arguments);
        }
        functions_00.count = functions.count;
        functions_00.data = functions.data;
        functions_00._12_4_ = 0;
        AnalyzeFunctionArgumentsFinal
                  (ctx,&syntax->super_SynBase,value,functions_00,(syntax->arguments).head,&arguments
                  );
        functions_01.count = functions.count;
        functions_01.data = functions.data;
        arguments_00._12_4_ = uStack_674;
        arguments_00.count = arguments.count;
        generics_00.tail = generics.tail;
        generics_00.head = generics.head;
        arguments_00.data = arguments.data;
        functions_01._12_4_ = 0;
        this = (ExprSequence *)
               CreateFunctionCallFinal
                         (ctx,&syntax->super_SynBase,value,functions_01,generics_00,arguments_00,
                          true);
        if (this != (ExprSequence *)0x0) goto LAB_0016a369;
      }
    }
    else {
      name.begin = (char *)pSVar14[1].begin;
      name.end = (char *)pSVar14[1].end;
      path.tail = in_RCX;
      path.head = (SynIdentifier *)pSVar14[1]._vptr_SynBase;
      pEVar7 = CreateVariableAccess(ctx,pSVar14,path,name,false);
      if (pEVar7 != (ExprBase *)0x0) goto LAB_0016a19c;
      if (pSVar14[1]._vptr_SynBase == (_func_int **)0x0) {
        pSVar14 = syntax->value;
        goto LAB_0016a171;
      }
    }
LAB_0016a2a0:
    if (((TypeBase *)value[1]._vptr_ExprBase)->isGeneric == false) {
      variable = anon_unknown.dwarf_b837c::AllocateTemporary
                           (ctx,&syntax->super_SynBase,(TypeBase *)value[1]._vptr_ExprBase);
      pEVar7 = CreateVariableAccess(ctx,&syntax->super_SynBase,variable,false);
      pEVar7 = CreateGetAddress(ctx,&syntax->super_SynBase,pEVar7);
      iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
      pEVar9 = (ExprBase *)CONCAT44(extraout_var_01,iVar4);
      pTVar6 = ctx->typeVoid;
      iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
      pp_Var10 = (_func_int **)CONCAT44(extraout_var_02,iVar4);
      *pp_Var10 = (_func_int *)0x0;
      pp_Var10[1] = (_func_int *)variable;
      pp_Var10[2] = (_func_int *)0x0;
      *(undefined1 *)(pp_Var10 + 3) = 0;
      pEVar9->typeID = 0x1e;
      pEVar9->source = &syntax->super_SynBase;
      pEVar9->type = pTVar6;
      pEVar9->next = (ExprBase *)0x0;
      pEVar9->listed = false;
      pEVar9->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240a48;
      pEVar9[1]._vptr_ExprBase = pp_Var10;
      *(undefined8 *)&pEVar9[1].typeID = 0;
      definition = pEVar9;
      pEVar7 = CreateConstructorAccess
                         (ctx,&syntax->super_SynBase,(TypeBase *)value[1]._vptr_ExprBase,
                          (syntax->arguments).head == (SynCallArgument *)0x0,pEVar7);
      if (pEVar7 != (ExprBase *)0x0) {
        functions.count = 0;
        GetNodeFunctions(ctx,&syntax->super_SynBase,pEVar7,&functions);
        if (arguments.count == 0) {
          AnalyzeFunctionArgumentsEarly(ctx,(syntax->arguments).head,&arguments);
        }
        functions_04.count = functions.count;
        functions_04.data = functions.data;
        functions_04._12_4_ = 0;
        AnalyzeFunctionArgumentsFinal
                  (ctx,&syntax->super_SynBase,value,functions_04,(syntax->arguments).head,&arguments
                  );
        functions_05.count = functions.count;
        functions_05.data = functions.data;
        arguments_02._12_4_ = uStack_684;
        arguments_02.count = arguments.count;
        generics_02.tail = generics.tail;
        generics_02.head = generics.head;
        arguments_02.data = arguments.data;
        functions_05._12_4_ = 0;
        call = CreateFunctionCallFinal
                         (ctx,&syntax->super_SynBase,value,functions_05,generics_02,arguments_02,
                          false);
        local_6e8._24_8_ = ctx->allocator;
        arguments_2.head = (ExprBase *)local_6e8;
        arguments_2.tail._0_4_ = 0;
        arguments_2.tail._4_4_ = 3;
        SmallArray<ExprBase_*,_3U>::push_back
                  ((SmallArray<ExprBase_*,_3U> *)&arguments_2,&definition);
        SmallArray<ExprBase_*,_3U>::push_back((SmallArray<ExprBase_*,_3U> *)&arguments_2,&call);
        local_670 = CreateVariableAccess(ctx,&syntax->super_SynBase,variable,false);
        SmallArray<ExprBase_*,_3U>::push_back((SmallArray<ExprBase_*,_3U> *)&arguments_2,&local_670)
        ;
        iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
        this = (ExprSequence *)CONCAT44(extraout_var_03,iVar4);
        arr.count = arguments_2.tail._0_4_;
        arr.data = (ExprBase **)arguments_2.head;
        arr._12_4_ = 0;
        ExprSequence::ExprSequence
                  (this,ctx->allocator,&syntax->super_SynBase,(TypeBase *)value[1]._vptr_ExprBase,
                   arr);
        SmallArray<ExprBase_*,_3U>::~SmallArray((SmallArray<ExprBase_*,_3U> *)&arguments_2);
        goto LAB_0016a369;
      }
      if ((syntax->arguments).head == (SynCallArgument *)0x0) {
        local_6e8._16_8_ = ctx->allocator;
        arguments_2.head = (ExprBase *)local_6e8;
        arguments_2.tail._0_4_ = 0;
        arguments_2.tail._4_4_ = 2;
        SmallArray<ExprBase_*,_2U>::push_back
                  ((SmallArray<ExprBase_*,_2U> *)&arguments_2,&definition);
        call = CreateVariableAccess(ctx,&syntax->super_SynBase,variable,false);
        SmallArray<ExprBase_*,_2U>::push_back((SmallArray<ExprBase_*,_2U> *)&arguments_2,&call);
        iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
        this = (ExprSequence *)CONCAT44(extraout_var_06,iVar4);
        arr_00.count = arguments_2.tail._0_4_;
        arr_00.data = (ExprBase **)arguments_2.head;
        arr_00._12_4_ = 0;
        ExprSequence::ExprSequence
                  (this,ctx->allocator,&syntax->super_SynBase,(TypeBase *)value[1]._vptr_ExprBase,
                   arr_00);
        SmallArray<ExprBase_*,_2U>::~SmallArray((SmallArray<ExprBase_*,_2U> *)&arguments_2);
        goto LAB_0016a369;
      }
    }
  }
  functions.count = 0;
  GetNodeFunctions(ctx,&syntax->super_SynBase,value,&functions);
  if (arguments.count == 0) {
    AnalyzeFunctionArgumentsEarly(ctx,(syntax->arguments).head,&arguments);
  }
  functions_02.count = functions.count;
  functions_02.data = functions.data;
  functions_02._12_4_ = 0;
  AnalyzeFunctionArgumentsFinal
            (ctx,&syntax->super_SynBase,value,functions_02,(syntax->arguments).head,&arguments);
  functions_03.count = functions.count;
  functions_03.data = functions.data;
  arguments_01._12_4_ = uStack_694;
  arguments_01.count = arguments.count;
  generics_01.tail = generics.tail;
  generics_01.head = generics.head;
  arguments_01.data = arguments.data;
  functions_03._12_4_ = 0;
  this = (ExprSequence *)
         CreateFunctionCallFinal
                   (ctx,&syntax->super_SynBase,value,functions_03,generics_01,arguments_01,false);
LAB_0016a369:
  SmallArray<ArgumentData,_16U>::~SmallArray(&arguments);
  SmallArray<FunctionValue,_32U>::~SmallArray(&functions);
  return &this->super_ExprBase;
}

Assistant:

ExprBase* AnalyzeFunctionCall(ExpressionContext &ctx, SynFunctionCall *syntax)
{
	ExprBase *function = AnalyzeExpression(ctx, syntax->value);

	if(isType<TypeError>(function->type))
	{
		IntrusiveList<ExprBase> arguments;

		for(SynCallArgument *el = syntax->arguments.head; el; el = getType<SynCallArgument>(el->next))
			arguments.push_back(AnalyzeExpression(ctx, el->value));

		return new (ctx.get<ExprFunctionCall>()) ExprFunctionCall(syntax, ctx.GetErrorType(), function, arguments);
	}

	IntrusiveList<TypeHandle> generics;

	for(SynBase *curr = syntax->aliases.head; curr; curr = curr->next)
	{
		TypeBase *type = AnalyzeType(ctx, curr);

		if(type == ctx.typeAuto)
			Stop(ctx, syntax, "ERROR: explicit generic argument type can't be auto");

		if(type == ctx.typeVoid)
			Stop(ctx, syntax, "ERROR: explicit generic argument cannot be a void type");

		generics.push_back(new (ctx.get<TypeHandle>()) TypeHandle(type));
	}

	// Collect a set of available functions
	SmallArray<FunctionValue, 32> functions(ctx.allocator);
	SmallArray<ArgumentData, 16> arguments(ctx.allocator);

	if(ExprTypeLiteral *type = getType<ExprTypeLiteral>(function))
	{
		if(TypeClass *typeClass = getType<TypeClass>(type->value))
		{
			if(!typeClass->completed)
			{
				Report(ctx, syntax, "ERROR: type '%.*s' is not fully defined", FMT_ISTR(typeClass->name));

				IntrusiveList<ExprBase> arguments;

				for(SynCallArgument *el = syntax->arguments.head; el; el = getType<SynCallArgument>(el->next))
					arguments.push_back(AnalyzeExpression(ctx, el->value));

				return new (ctx.get<ExprFunctionCall>()) ExprFunctionCall(syntax, ctx.GetErrorType(), function, arguments);
			}
		}

		if(isType<TypeError>(type->value))
		{
			IntrusiveList<ExprBase> arguments;

			for(SynCallArgument *el = syntax->arguments.head; el; el = getType<SynCallArgument>(el->next))
				arguments.push_back(AnalyzeExpression(ctx, el->value));

			return new (ctx.get<ExprFunctionCall>()) ExprFunctionCall(syntax, ctx.GetErrorType(), function, arguments);
		}

		// Handle hasMember(x) expresion
		if(TypeMemberSet *memberSet = getType<TypeMemberSet>(type->value))
		{
			if(generics.empty() && syntax->arguments.size() == 1 && !syntax->arguments.head->name)
			{
				if(SynTypeSimple *name = getType<SynTypeSimple>(syntax->arguments.head->value))
				{
					if(name->path.empty())
					{
						for(MemberHandle *curr = memberSet->type->members.head; curr; curr = curr->next)
						{
							if(curr->variable->name->name == name->name)
								return new (ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(syntax, ctx.typeBool, true);
						}

						return new (ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(syntax, ctx.typeBool, false);
					}
				}
			}
		}

		ExprBase *regular = NULL;

		if(SynTypeSimple *node = getType<SynTypeSimple>(syntax->value))
		{
			regular = CreateVariableAccess(ctx, syntax->value, node->path, node->name, false);

			if(!regular && node->path.empty())
				regular = CreateVariableAccess(ctx, syntax->value, IntrusiveList<SynIdentifier>(), type->value->name, false);
		}
		else
		{
			regular = CreateVariableAccess(ctx, syntax->value, IntrusiveList<SynIdentifier>(), type->value->name, false);
		}

		if(regular)
		{
			// Collect a set of available functions
			functions.clear();
			GetNodeFunctions(ctx, syntax, regular, functions);

			// If only constructors are available, do not call as a regular function
			bool hasReturnValue = false;

			for(unsigned i = 0; i < functions.size(); i++)
			{
				if(functions[i].function->type->returnType != ctx.typeVoid)
				{
					hasReturnValue = true;
					break;
				}
			}

			if(hasReturnValue)
			{
				if(arguments.empty())
					AnalyzeFunctionArgumentsEarly(ctx, syntax->arguments.head, arguments);

				AnalyzeFunctionArgumentsFinal(ctx, syntax, function, functions, syntax->arguments.head, arguments);

				ExprBase *call = CreateFunctionCallFinal(ctx, syntax, function, functions, generics, arguments, true);

				if(call)
					return call;
			}
		}

		if(!type->value->isGeneric)
		{
			VariableData *variable = AllocateTemporary(ctx, syntax, type->value);

			ExprBase *pointer = CreateGetAddress(ctx, syntax, CreateVariableAccess(ctx, syntax, variable, false));

			ExprBase *definition = new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(syntax, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(NULL, variable), NULL);

			ExprBase *constructor = CreateConstructorAccess(ctx, syntax, type->value, syntax->arguments.empty(), pointer);

			if(!constructor && syntax->arguments.empty())
			{
				SmallArray<ExprBase*, 2> expressions(ctx.allocator);

				expressions.push_back(definition);
				expressions.push_back(CreateVariableAccess(ctx, syntax, variable, false));

				return new (ctx.get<ExprSequence>()) ExprSequence(ctx.allocator, syntax, type->value, expressions);
			}

			if(constructor)
			{
				// Collect a set of available functions
				functions.clear();
				GetNodeFunctions(ctx, syntax, constructor, functions);

				if(arguments.empty())
					AnalyzeFunctionArgumentsEarly(ctx, syntax->arguments.head, arguments);

				AnalyzeFunctionArgumentsFinal(ctx, syntax, function, functions, syntax->arguments.head, arguments);

				ExprBase *call = CreateFunctionCallFinal(ctx, syntax, function, functions, generics, arguments, false);

				SmallArray<ExprBase*, 3> expressions(ctx.allocator);

				expressions.push_back(definition);
				expressions.push_back(call);
				expressions.push_back(CreateVariableAccess(ctx, syntax, variable, false));

				return new (ctx.get<ExprSequence>()) ExprSequence(ctx.allocator, syntax, type->value, expressions);
			}
		}
	}

	// Collect a set of available functions
	functions.clear();
	GetNodeFunctions(ctx, syntax, function, functions);

	if(arguments.empty())
		AnalyzeFunctionArgumentsEarly(ctx, syntax->arguments.head, arguments);

	AnalyzeFunctionArgumentsFinal(ctx, syntax, function, functions, syntax->arguments.head, arguments);

	return CreateFunctionCallFinal(ctx, syntax, function, functions, generics, arguments, false);
}